

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericitemmodel.cpp
# Opt level: O3

QMap<int,_QVariant> __thiscall
QGenericItemModel::itemData(QGenericItemModel *this,QModelIndex *index)

{
  long lVar1;
  QAbstractItemModel *pQVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (index->m).ptr;
  *(undefined8 *)this = 0;
  (*(code *)(pQVar2->super_QObject)._vptr_QObject)(8,pQVar2,this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
            )(QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

QMap<int, QVariant> QGenericItemModel::itemData(const QModelIndex &index) const
{
    return impl->callConst<QMap<int, QVariant>>(QGenericItemModelImplBase::ItemData, index);
}